

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int libssh2_sftp_posix_rename_ex
              (LIBSSH2_SFTP *sftp,char *source_filename,size_t source_filename_len,
              char *dest_filename,size_t dest_filename_len)

{
  time_t start_time;
  time_t entry_time;
  int rc;
  size_t dest_filename_len_local;
  char *dest_filename_local;
  size_t source_filename_len_local;
  char *source_filename_local;
  LIBSSH2_SFTP *sftp_local;
  
  if (sftp == (LIBSSH2_SFTP *)0x0) {
    sftp_local._4_4_ = -0x27;
  }
  else {
    start_time = time((time_t *)0x0);
    do {
      entry_time._4_4_ =
           sftp_posix_rename(sftp,source_filename,source_filename_len,dest_filename,
                             dest_filename_len);
      if (((entry_time._4_4_ != -0x25) || (sftp->channel->session == (LIBSSH2_SESSION *)0x0)) ||
         (sftp->channel->session->api_block_mode == 0)) break;
      entry_time._4_4_ = _libssh2_wait_socket(sftp->channel->session,start_time);
    } while (entry_time._4_4_ == 0);
    sftp_local._4_4_ = entry_time._4_4_;
  }
  return sftp_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_sftp_posix_rename_ex(LIBSSH2_SFTP *sftp, const char *source_filename,
                             size_t source_filename_len,
                             const char *dest_filename,
                             size_t dest_filename_len)
{
    int rc;
    if(!sftp)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, sftp->channel->session,
                 sftp_posix_rename(sftp, source_filename, source_filename_len,
                                   dest_filename, dest_filename_len));
    return rc;
}